

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  undefined1 *puVar1;
  IfcElement *this_00;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                              super_IfcDistributionElement.super_IfcElement.super_IfcProduct.
                              super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            ((long)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + lVar3);
  plVar2 = (long *)((this->UserDefinedFunction).ptr.field_2._M_local_buf + lVar3);
  plVar2[-0x35] = 0x890b28;
  plVar2[3] = 0x890c90;
  plVar2[-0x24] = 0x890b50;
  plVar2[-0x22] = 0x890b78;
  plVar2[-0x1b] = 0x890ba0;
  plVar2[-0x15] = 0x890bc8;
  plVar2[-0xe] = 0x890bf0;
  plVar2[-0xc] = 0x890c18;
  plVar2[-10] = 0x890c40;
  plVar2[-8] = 0x890c68;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  puVar4 = *(undefined1 **)&this_00[1].super_IfcProduct.super_IfcObject.field_0x28;
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x38;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__00890cc0);
  operator_delete(this_00,0x1d8);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}